

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_profiler.cpp
# Opt level: O0

void __thiscall duckdb::QueryProfiler::QueryTreeToStream(QueryProfiler *this,ostream *ss)

{
  ostream *poVar1;
  bool bVar2;
  ulong uVar3;
  ClientContextState *pCVar4;
  pointer this_00;
  ostream *in_RSI;
  long in_RDI;
  string total_time;
  idx_t TOTAL_BOX_WIDTH;
  shared_ptr<duckdb::ClientContextState,_true> *state;
  iterator __end1;
  iterator __begin1;
  vector<duckdb::shared_ptr<duckdb::ClientContextState,_true>,_true> *__range1;
  idx_t in_stack_00000150;
  ProfilingInfo *in_stack_00000158;
  ostream *in_stack_00000160;
  lock_guard<std::mutex> guard;
  mutex_type *in_stack_fffffffffffffdd8;
  QueryProfiler *in_stack_fffffffffffffde0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffde8;
  BaseProfiler<std::chrono::_V2::steady_clock> *in_stack_fffffffffffffdf0;
  RegisteredStateManager *this_01;
  string *in_stack_fffffffffffffe48;
  string *in_stack_fffffffffffffe50;
  string *in_stack_fffffffffffffe58;
  string local_198 [32];
  string local_178 [8];
  idx_t in_stack_fffffffffffffe90;
  string *in_stack_fffffffffffffe98;
  string local_158 [32];
  string local_138 [32];
  undefined8 local_118;
  reference local_110;
  shared_ptr<duckdb::ClientContextState,_true> *local_108;
  __normal_iterator<duckdb::shared_ptr<duckdb::ClientContextState,_true>_*,_std::vector<duckdb::shared_ptr<duckdb::ClientContextState,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ClientContextState,_true>_>_>_>
  local_100;
  double in_stack_ffffffffffffff08;
  allocator<char> local_d1;
  string local_d0 [39];
  allocator local_a9;
  string local_a8 [32];
  string local_88 [8];
  ostream *in_stack_ffffffffffffff80;
  ProfilingNode *in_stack_ffffffffffffff88;
  QueryProfiler *in_stack_ffffffffffffff90;
  string local_68 [32];
  string local_48 [56];
  ostream *local_10;
  
  local_10 = in_RSI;
  ::std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  ::std::operator<<(local_10,anon_var_dwarf_9fc422);
  ::std::operator<<(local_10,anon_var_dwarf_9fc42e);
  ::std::operator<<(local_10,anon_var_dwarf_9fc43a);
  ::std::operator<<(local_10,anon_var_dwarf_9fc446);
  ::std::operator<<(local_10,anon_var_dwarf_9fc452);
  poVar1 = local_10;
  ::std::__cxx11::string::string(local_88,(string *)(in_RDI + 0x48));
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_a8,anon_var_dwarf_3eb6436 + 8,&local_a9);
  this_01 = (RegisteredStateManager *)&local_d1;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_d0," ",(allocator *)this_01);
  StringUtil::Replace(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,in_stack_fffffffffffffe48)
  ;
  ::std::operator+(in_stack_fffffffffffffde8,(char *)in_stack_fffffffffffffde0);
  ::std::operator<<(poVar1,local_48);
  ::std::__cxx11::string::~string(local_48);
  ::std::__cxx11::string::~string(local_68);
  ::std::__cxx11::string::~string(local_d0);
  ::std::allocator<char>::~allocator(&local_d1);
  ::std::__cxx11::string::~string(local_a8);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  ::std::__cxx11::string::~string(local_88);
  uVar3 = ::std::__cxx11::string::empty();
  if (((uVar3 & 1) == 0) ||
     (bVar2 = ::std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>_>
                          *)0x89d72b), bVar2)) {
    unique_ptr<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>,_true>
    ::operator->((unique_ptr<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>,_true>
                  *)in_stack_fffffffffffffde0);
    RegisteredStateManager::States(this_01);
    local_100._M_current =
         (shared_ptr<duckdb::ClientContextState,_true> *)
         ::std::
         vector<duckdb::shared_ptr<duckdb::ClientContextState,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ClientContextState,_true>_>_>
         ::begin((vector<duckdb::shared_ptr<duckdb::ClientContextState,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ClientContextState,_true>_>_>
                  *)in_stack_fffffffffffffdd8);
    local_108 = (shared_ptr<duckdb::ClientContextState,_true> *)
                ::std::
                vector<duckdb::shared_ptr<duckdb::ClientContextState,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ClientContextState,_true>_>_>
                ::end((vector<duckdb::shared_ptr<duckdb::ClientContextState,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ClientContextState,_true>_>_>
                       *)in_stack_fffffffffffffdd8);
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<duckdb::shared_ptr<duckdb::ClientContextState,_true>_*,_std::vector<duckdb::shared_ptr<duckdb::ClientContextState,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ClientContextState,_true>_>_>_>
                               *)in_stack_fffffffffffffde0,
                              (__normal_iterator<duckdb::shared_ptr<duckdb::ClientContextState,_true>_*,_std::vector<duckdb::shared_ptr<duckdb::ClientContextState,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ClientContextState,_true>_>_>_>
                               *)in_stack_fffffffffffffdd8), bVar2) {
      local_110 = __gnu_cxx::
                  __normal_iterator<duckdb::shared_ptr<duckdb::ClientContextState,_true>_*,_std::vector<duckdb::shared_ptr<duckdb::ClientContextState,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ClientContextState,_true>_>_>_>
                  ::operator*(&local_100);
      pCVar4 = shared_ptr<duckdb::ClientContextState,_true>::operator->
                         ((shared_ptr<duckdb::ClientContextState,_true> *)in_stack_fffffffffffffde0)
      ;
      (**(code **)(*(long *)pCVar4 + 0x78))(pCVar4,local_10);
      __gnu_cxx::
      __normal_iterator<duckdb::shared_ptr<duckdb::ClientContextState,_true>_*,_std::vector<duckdb::shared_ptr<duckdb::ClientContextState,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ClientContextState,_true>_>_>_>
      ::operator++(&local_100);
    }
    vector<duckdb::shared_ptr<duckdb::ClientContextState,_true>,_true>::~vector
              ((vector<duckdb::shared_ptr<duckdb::ClientContextState,_true>,_true> *)0x89d8c2);
    local_118 = 0x32;
    ::std::operator<<(local_10,anon_var_dwarf_9fc36e);
    ::std::operator<<(local_10,anon_var_dwarf_9fc3aa);
    BaseProfiler<std::chrono::_V2::steady_clock>::Elapsed(in_stack_fffffffffffffdf0);
    RenderTiming_abi_cxx11_(in_stack_ffffffffffffff08);
    ::std::operator+((char *)in_stack_fffffffffffffde8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffde0);
    ::std::__cxx11::string::~string(local_158);
    poVar1 = local_10;
    DrawPadded(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
    ::std::operator+((char *)in_stack_fffffffffffffde8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffde0);
    ::std::operator+(in_stack_fffffffffffffde8,(char *)in_stack_fffffffffffffde0);
    ::std::operator<<(poVar1,local_178);
    ::std::__cxx11::string::~string(local_178);
    ::std::__cxx11::string::~string(local_198);
    ::std::__cxx11::string::~string((string *)&stack0xfffffffffffffe48);
    ::std::operator<<(local_10,anon_var_dwarf_9fc3ce);
    ::std::operator<<(local_10,anon_var_dwarf_9fc3da);
    bVar2 = ::std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>_>
                        *)0x89daa1);
    if (bVar2) {
      bVar2 = PrintOptimizerOutput(in_stack_fffffffffffffde0);
      if (bVar2) {
        this_00 = unique_ptr<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>,_true>
                  ::operator->((unique_ptr<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>,_true>
                                *)in_stack_fffffffffffffde0);
        ProfilingNode::GetProfilingInfo(this_00);
        PrintPhaseTimingsToStream(in_stack_00000160,in_stack_00000158,in_stack_00000150);
      }
      unique_ptr<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>,_true>::operator*
                ((unique_ptr<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>,_true>
                  *)in_stack_fffffffffffffde0);
      Render(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    }
    ::std::__cxx11::string::~string(local_138);
  }
  ::std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x89dc0f);
  return;
}

Assistant:

void QueryProfiler::QueryTreeToStream(std::ostream &ss) const {
	lock_guard<std::mutex> guard(lock);
	ss << "┌─────────────────────────────────────┐\n";
	ss << "│┌───────────────────────────────────┐│\n";
	ss << "││    Query Profiling Information    ││\n";
	ss << "│└───────────────────────────────────┘│\n";
	ss << "└─────────────────────────────────────┘\n";
	ss << StringUtil::Replace(query_info.query_name, "\n", " ") + "\n";

	// checking the tree to ensure the query is really empty
	// the query string is empty when a logical plan is deserialized
	if (query_info.query_name.empty() && !root) {
		return;
	}

	for (auto &state : context.registered_state->States()) {
		state->WriteProfilingInformation(ss);
	}

	constexpr idx_t TOTAL_BOX_WIDTH = 50;
	ss << "┌────────────────────────────────────────────────┐\n";
	ss << "│┌──────────────────────────────────────────────┐│\n";
	string total_time = "Total Time: " + RenderTiming(main_query.Elapsed());
	ss << "││" + DrawPadded(total_time, TOTAL_BOX_WIDTH - 4) + "││\n";
	ss << "│└──────────────────────────────────────────────┘│\n";
	ss << "└────────────────────────────────────────────────┘\n";
	// render the main operator tree
	if (root) {
		// print phase timings
		if (PrintOptimizerOutput()) {
			PrintPhaseTimingsToStream(ss, root->GetProfilingInfo(), TOTAL_BOX_WIDTH);
		}
		Render(*root, ss);
	}
}